

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# error.cpp
# Opt level: O0

void __thiscall boost::deflate::error_test::check(error_test *this,char *name,error ev)

{
  runner *prVar1;
  error eVar2;
  bool cond;
  byte bVar3;
  int iVar4;
  runner **pprVar5;
  error_category *peVar6;
  undefined4 extraout_var;
  error_category *peVar7;
  undefined4 extraout_var_00;
  undefined8 local_b0 [2];
  string local_a0;
  allocator<char> local_69;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  error_code local_48;
  error_category *local_38;
  error_category *cat;
  error_code ec;
  error ev_local;
  char *name_local;
  error_test *this_local;
  
  ec.cat_._4_4_ = ev;
  _cat = make_error_code(ev);
  local_48 = make_error_code(0);
  local_38 = system::error_code::category(&local_48);
  pprVar5 = test_suite::detail::current();
  prVar1 = *pprVar5;
  peVar6 = system::error_code::category((error_code *)&cat);
  iVar4 = (**peVar6->_vptr_error_category)();
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_68,(char *)CONCAT44(extraout_var,iVar4),&local_69);
  cond = std::operator==(&local_68,name);
  test_suite::detail::runner::maybe_fail<bool>
            (prVar1,cond,"std::string{ec.category().name()} == name",
             "/workspace/llm4binary/github/license_all_cmakelists_25/ryanjanson[P]Deflate/test/error.cpp"
             ,0x1b,"void boost::deflate::error_test::check(const char *, error)",(char *)0x0);
  std::__cxx11::string::~string((string *)&local_68);
  std::allocator<char>::~allocator(&local_69);
  pprVar5 = test_suite::detail::current();
  prVar1 = *pprVar5;
  system::error_code::message_abi_cxx11_(&local_a0,(error_code *)&cat);
  bVar3 = std::__cxx11::string::empty();
  test_suite::detail::runner::maybe_fail<bool>
            (prVar1,(bool)(bVar3 ^ 1),"! ec.message().empty()",
             "/workspace/llm4binary/github/license_all_cmakelists_25/ryanjanson[P]Deflate/test/error.cpp"
             ,0x1c,"void boost::deflate::error_test::check(const char *, error)",(char *)0x0);
  std::__cxx11::string::~string((string *)&local_a0);
  pprVar5 = test_suite::detail::current();
  prVar1 = *pprVar5;
  peVar6 = system::error_code::category((error_code *)&cat);
  test_suite::detail::runner::maybe_fail<bool>
            (prVar1,peVar6 == local_38,"std::addressof(ec.category()) == std::addressof(cat)",
             "/workspace/llm4binary/github/license_all_cmakelists_25/ryanjanson[P]Deflate/test/error.cpp"
             ,0x1e,"void boost::deflate::error_test::check(const char *, error)",(char *)0x0);
  pprVar5 = test_suite::detail::current();
  eVar2 = ec.cat_._4_4_;
  peVar6 = local_38;
  prVar1 = *pprVar5;
  peVar7 = system::error_code::category((error_code *)&cat);
  iVar4 = (*peVar7->_vptr_error_category[1])(peVar7,(ulong)ec.cat_._4_4_);
  local_b0[0] = CONCAT44(extraout_var_00,iVar4);
  iVar4 = (*peVar6->_vptr_error_category[2])(peVar6,(ulong)eVar2,local_b0);
  test_suite::detail::runner::maybe_fail<bool>
            (prVar1,(bool)((byte)iVar4 & 1),
             "cat.equivalent( static_cast<std::underlying_type<error>::type>(ev), ec.category().default_error_condition( static_cast<std::underlying_type<error>::type>(ev)))"
             ,
             "/workspace/llm4binary/github/license_all_cmakelists_25/ryanjanson[P]Deflate/test/error.cpp"
             ,0x22,"void boost::deflate::error_test::check(const char *, error)",(char *)0x0);
  pprVar5 = test_suite::detail::current();
  prVar1 = *pprVar5;
  iVar4 = (*local_38->_vptr_error_category[3])(local_38,&cat,(ulong)ec.cat_._4_4_);
  test_suite::detail::runner::maybe_fail<bool>
            (prVar1,(bool)((byte)iVar4 & 1),
             "cat.equivalent(ec, static_cast<std::underlying_type<error>::type>(ev))",
             "/workspace/llm4binary/github/license_all_cmakelists_25/ryanjanson[P]Deflate/test/error.cpp"
             ,0x24,"void boost::deflate::error_test::check(const char *, error)",(char *)0x0);
  return;
}

Assistant:

void check(char const* name, error ev)
    {
        auto const ec = make_error_code(ev);
        auto const& cat = make_error_code(
            static_cast<deflate::error>(0)).category();
        BOOST_TEST(std::string{ec.category().name()} == name);
        BOOST_TEST(! ec.message().empty());
        BOOST_TEST(
            std::addressof(ec.category()) == std::addressof(cat));
        BOOST_TEST(cat.equivalent(
            static_cast<std::underlying_type<error>::type>(ev),
                ec.category().default_error_condition(
                    static_cast<std::underlying_type<error>::type>(ev))));
        BOOST_TEST(cat.equivalent(ec,
            static_cast<std::underlying_type<error>::type>(ev)));
    }